

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int flags,
                     sqlite3_blob **ppBlob)

{
  long lVar1;
  int iVar2;
  Incrblob *p;
  Vdbe *pVVar3;
  char *zFormat;
  bool local_8d;
  int iDb;
  Vdbe *v;
  int j_1;
  int j;
  FKey *pFKey;
  Index *pIdx;
  char *zFault;
  Incrblob *pBlob;
  Parse *pParse;
  Table *pTab;
  char *zErr;
  int rc;
  int iCol;
  int nAttempt;
  int flags_local;
  sqlite_int64 iRow_local;
  char *zColumn_local;
  char *zTable_local;
  char *zDb_local;
  sqlite3 *db_local;
  
  rc = 0;
  zErr._0_4_ = 0;
  pTab = (Table *)0x0;
  pBlob = (Incrblob *)0x0;
  iCol = (int)(flags != 0);
  *ppBlob = (sqlite3_blob *)0x0;
  _nAttempt = iRow;
  iRow_local = (sqlite_int64)zColumn;
  zColumn_local = zTable;
  zTable_local = zDb;
  zDb_local = (char *)db;
  sqlite3_mutex_enter(db->mutex);
  p = (Incrblob *)sqlite3DbMallocZero((sqlite3 *)zDb_local,0x28);
  if ((p != (Incrblob *)0x0) &&
     (pBlob = (Incrblob *)sqlite3DbMallocRaw((sqlite3 *)zDb_local,0x298),
     (Parse *)pBlob != (Parse *)0x0)) {
    do {
      memset(pBlob,0,0x298);
      ((Parse *)pBlob)->db = (sqlite3 *)zDb_local;
      sqlite3DbFree((sqlite3 *)zDb_local,pTab);
      pTab = (Table *)0x0;
      sqlite3BtreeEnterAll((sqlite3 *)zDb_local);
      pParse = (Parse *)sqlite3LocateTable((Parse *)pBlob,0,zColumn_local,zTable_local);
      if ((pParse != (Parse *)0x0) && ((*(u8 *)((long)pParse->aTempReg + 0x1e) & 0x10) != 0)) {
        pParse = (Parse *)0x0;
        sqlite3ErrorMsg((Parse *)pBlob,"cannot open virtual table: %s",zColumn_local);
      }
      if ((pParse != (Parse *)0x0) &&
         (lVar1._0_4_ = pParse->rc, lVar1._4_1_ = pParse->colNamesSet,
         lVar1._5_1_ = pParse->checkSchema, lVar1._6_1_ = pParse->nested,
         lVar1._7_1_ = pParse->nTempReg, lVar1 != 0)) {
        pParse = (Parse *)0x0;
        sqlite3ErrorMsg((Parse *)pBlob,"cannot open view: %s",zColumn_local);
      }
      if (pParse == (Parse *)0x0) {
        if (((Parse *)pBlob)->zErrMsg != (char *)0x0) {
          sqlite3DbFree((sqlite3 *)zDb_local,pTab);
          pTab = (Table *)((Parse *)pBlob)->zErrMsg;
          ((Parse *)pBlob)->zErrMsg = (char *)0x0;
        }
        zErr._0_4_ = 1;
        sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
        break;
      }
      zErr._4_4_ = 0;
      while ((zErr._4_4_ < *(short *)((long)pParse->aTempReg + 0x1a) &&
             (iVar2 = sqlite3_stricmp(*(char **)(pParse->zErrMsg + (long)zErr._4_4_ * 0x30),
                                      (char *)iRow_local), iVar2 != 0))) {
        zErr._4_4_ = zErr._4_4_ + 1;
      }
      if (zErr._4_4_ == *(short *)((long)pParse->aTempReg + 0x1a)) {
        sqlite3DbFree((sqlite3 *)zDb_local,pTab);
        pTab = (Table *)sqlite3MPrintf((sqlite3 *)zDb_local,"no such column: \"%s\"",iRow_local);
        zErr._0_4_ = 1;
        sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
        break;
      }
      if (iCol != 0) {
        pIdx = (Index *)0x0;
        if ((*(uint *)(zDb_local + 0x2c) & 0x40000) != 0) {
          j_1._0_1_ = pParse->nTempInUse;
          j_1._1_1_ = pParse->nColCache;
          j_1._2_1_ = pParse->iColCache;
          j_1._3_1_ = pParse->isMultiWrite;
          unique0x00012004 = pParse->mayAbort;
          unique0x00012005 = *(undefined3 *)&pParse->field_0x25;
          for (; _j_1 != 0; _j_1 = *(long *)(_j_1 + 8)) {
            for (v._4_4_ = 0; v._4_4_ < *(int *)(_j_1 + 0x28); v._4_4_ = v._4_4_ + 1) {
              if (*(int *)(_j_1 + 0x40 + (long)v._4_4_ * 0x10) == zErr._4_4_) {
                pIdx = (Index *)anon_var_dwarf_80494;
              }
            }
          }
        }
        for (pFKey = (FKey *)pParse->pVdbe; pFKey != (FKey *)0x0; pFKey = *(FKey **)&pFKey->nCol) {
          for (v._0_4_ = 0; (int)v < (int)(uint)*(ushort *)((long)&pFKey->aCol[0].zCol + 4);
              v._0_4_ = (int)v + 1) {
            if (*(int *)(pFKey->pNextFrom->aAction + (long)(int)v * 4 + -0x2d) == zErr._4_4_) {
              pIdx = (Index *)0x1f7418;
            }
          }
        }
        if (pIdx != (Index *)0x0) {
          sqlite3DbFree((sqlite3 *)zDb_local,pTab);
          pTab = (Table *)sqlite3MPrintf((sqlite3 *)zDb_local,"cannot open %s column for writing",
                                         pIdx);
          zErr._0_4_ = 1;
          sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
          break;
        }
      }
      pVVar3 = sqlite3VdbeCreate((sqlite3 *)zDb_local);
      p->pStmt = (sqlite3_stmt *)pVVar3;
      if (p->pStmt != (sqlite3_stmt *)0x0) {
        pVVar3 = (Vdbe *)p->pStmt;
        iVar2 = sqlite3SchemaToIndex((sqlite3 *)zDb_local,*(Schema **)&pParse->iCacheLevel);
        sqlite3VdbeAddOpList(pVVar3,0xc,sqlite3_blob_open::openBlob);
        sqlite3VdbeChangeP1(pVVar3,0,iVar2);
        sqlite3VdbeChangeP2(pVVar3,0,iCol);
        sqlite3VdbeChangeP1(pVVar3,1,iVar2);
        sqlite3VdbeChangeP2(pVVar3,1,**(int **)&pParse->iCacheLevel);
        sqlite3VdbeChangeP3(pVVar3,1,*(int *)(*(long *)&pParse->iCacheLevel + 4));
        sqlite3VdbeUsesBtree(pVVar3,iVar2);
        sqlite3VdbeChangeP1(pVVar3,2,iVar2);
        sqlite3VdbeChangeP2(pVVar3,2,pParse->aTempReg[5]);
        sqlite3VdbeChangeP3(pVVar3,2,iCol);
        sqlite3VdbeChangeP4(pVVar3,2,(char *)pParse->db,0);
        sqlite3VdbeChangeToNoop(pVVar3,4 - iCol);
        sqlite3VdbeChangeP2(pVVar3,iCol + 3,pParse->aTempReg[5]);
        sqlite3VdbeChangeP3(pVVar3,iCol + 3,iVar2);
        sqlite3VdbeChangeP4(pVVar3,iCol + 3,
                            (char *)(long)(*(short *)((long)pParse->aTempReg + 0x1a) + 1),-0xe);
        sqlite3VdbeChangeP2(pVVar3,7,(int)*(short *)((long)pParse->aTempReg + 0x1a));
        if (zDb_local[0x50] == '\0') {
          ((Parse *)pBlob)->nVar = 1;
          ((Parse *)pBlob)->nMem = 1;
          ((Parse *)pBlob)->nTab = 1;
          sqlite3VdbeMakeReady(pVVar3,(Parse *)pBlob);
        }
      }
      p->flags = iCol;
      p->iCol = zErr._4_4_;
      p->db = (sqlite3 *)zDb_local;
      sqlite3BtreeLeaveAll((sqlite3 *)zDb_local);
      if (zDb_local[0x50] != '\0') break;
      sqlite3_bind_int64(p->pStmt,1,_nAttempt);
      zErr._0_4_ = blobSeekToRow(p,_nAttempt,(char **)&pTab);
      rc = rc + 1;
      local_8d = rc < 0x32 && (int)zErr == 0x11;
    } while (local_8d);
  }
  if (((int)zErr == 0) && (zDb_local[0x50] == '\0')) {
    *ppBlob = (sqlite3_blob *)p;
  }
  else {
    if ((p != (Incrblob *)0x0) && (p->pStmt != (sqlite3_stmt *)0x0)) {
      sqlite3VdbeFinalize((Vdbe *)p->pStmt);
    }
    sqlite3DbFree((sqlite3 *)zDb_local,p);
  }
  zFormat = (char *)0x0;
  if (pTab != (Table *)0x0) {
    zFormat = "%s";
  }
  sqlite3Error((sqlite3 *)zDb_local,(int)zErr,zFormat,pTab);
  sqlite3DbFree((sqlite3 *)zDb_local,pTab);
  sqlite3DbFree((sqlite3 *)zDb_local,pBlob);
  zErr._0_4_ = sqlite3ApiExit((sqlite3 *)zDb_local,(int)zErr);
  sqlite3_mutex_leave(*(sqlite3_mutex **)(zDb_local + 0x18));
  return (int)zErr;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int flags,              /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */

  /* This VDBE program seeks a btree cursor to the identified 
  ** db/table/row entry. The reason for using a vdbe program instead
  ** of writing code to use the b-tree layer directly is that the
  ** vdbe program will take advantage of the various transaction,
  ** locking and error handling infrastructure built into the vdbe.
  **
  ** After seeking the cursor, the vdbe executes an OP_ResultRow.
  ** Code external to the Vdbe then "borrows" the b-tree cursor and
  ** uses it to implement the blob_read(), blob_write() and 
  ** blob_bytes() functions.
  **
  ** The sqlite3_blob_close() function finalizes the vdbe program,
  ** which closes the b-tree cursor and (possibly) commits the 
  ** transaction.
  */
  static const VdbeOpList openBlob[] = {
    {OP_Transaction, 0, 0, 0},     /* 0: Start a transaction */
    {OP_VerifyCookie, 0, 0, 0},    /* 1: Check the schema cookie */
    {OP_TableLock, 0, 0, 0},       /* 2: Acquire a read or write lock */

    /* One of the following two instructions is replaced by an OP_Noop. */
    {OP_OpenRead, 0, 0, 0},        /* 3: Open cursor 0 for reading */
    {OP_OpenWrite, 0, 0, 0},       /* 4: Open cursor 0 for read/write */

    {OP_Variable, 1, 1, 1},        /* 5: Push the rowid to the stack */
    {OP_NotExists, 0, 10, 1},      /* 6: Seek the cursor */
    {OP_Column, 0, 0, 1},          /* 7  */
    {OP_ResultRow, 1, 0, 0},       /* 8  */
    {OP_Goto, 0, 5, 0},            /* 9  */
    {OP_Close, 0, 0, 0},           /* 10 */
    {OP_Halt, 0, 0, 0},            /* 11 */
  };

  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

  flags = !!flags;                /* flags = (flags ? 1 : 0); */
  *ppBlob = 0;

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    ** It is against the rules to open a column to which either of these
    ** descriptions applies for writing.  */
    if( flags ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nColumn; j++){
          if( pIdx->aiColumn[j]==iCol ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(db);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

      sqlite3VdbeAddOpList(v, sizeof(openBlob)/sizeof(VdbeOpList), openBlob);


      /* Configure the OP_Transaction */
      sqlite3VdbeChangeP1(v, 0, iDb);
      sqlite3VdbeChangeP2(v, 0, flags);

      /* Configure the OP_VerifyCookie */
      sqlite3VdbeChangeP1(v, 1, iDb);
      sqlite3VdbeChangeP2(v, 1, pTab->pSchema->schema_cookie);
      sqlite3VdbeChangeP3(v, 1, pTab->pSchema->iGeneration);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
      sqlite3VdbeChangeToNoop(v, 2);
#else
      sqlite3VdbeChangeP1(v, 2, iDb);
      sqlite3VdbeChangeP2(v, 2, pTab->tnum);
      sqlite3VdbeChangeP3(v, 2, flags);
      sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
#endif

      /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
      ** parameter of the other to pTab->tnum.  */
      sqlite3VdbeChangeToNoop(v, 4 - flags);
      sqlite3VdbeChangeP2(v, 3 + flags, pTab->tnum);
      sqlite3VdbeChangeP3(v, 3 + flags, iDb);

      /* Configure the number of columns. Configure the cursor to
      ** think that the table has one more column than it really
      ** does. An OP_Column to retrieve this imaginary column will
      ** always return an SQL NULL. This is useful because it means
      ** we can invoke OP_Column to fill in the vdbe cursors type 
      ** and offset cache without causing any IO.
      */
      sqlite3VdbeChangeP4(v, 3+flags, SQLITE_INT_TO_PTR(pTab->nCol+1),P4_INT32);
      sqlite3VdbeChangeP2(v, 7, pTab->nCol);
      if( !db->mallocFailed ){
        pParse->nVar = 1;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->flags = flags;
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    sqlite3_bind_int64(pBlob->pStmt, 1, iRow);
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3Error(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}